

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O2

int Aig_ManVerifyUsingBdds_int(Aig_Man_t *p,Saig_ParBbr_t *pPars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  DdManager *dd;
  abctime aVar6;
  Vec_Ptr_t *vOnionRings;
  DdNode **pbOutputs;
  DdNode **pbParts;
  DdNode *n;
  DdNode *pDVar7;
  Abc_Cex_t *pAVar8;
  int fVerbose;
  ulong uVar9;
  long lVar10;
  int iVar11;
  char *dd_00;
  DdManager *pDVar12;
  
  iVar11 = pPars->fSkipOutCheck;
  aVar5 = Abc_Clock();
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                  ,0x1c0,"int Aig_ManVerifyUsingBdds_int(Aig_Man_t *, Saig_ParBbr_t *)");
  }
  dd_00 = (char *)p;
  dd = Aig_ManComputeGlobalBdds(p,pPars->nBddMax,1,pPars->fReorder,pPars->fVerbose);
  if (dd == (DdManager *)0x0) {
    iVar4 = -1;
    if (pPars->fSilent == 0) {
      printf("The number of intermediate BDD nodes exceeded the limit (%d).\n",
             (ulong)(uint)pPars->nBddMax);
    }
  }
  else {
    if (pPars->fVerbose != 0) {
      uVar2 = Cudd_ReadKeys(dd);
      uVar3 = Cudd_ReadDead(dd);
      dd_00 = "Shared BDD size is %6d nodes.\n";
      printf("Shared BDD size is %6d nodes.\n",(ulong)(uVar2 - uVar3));
    }
    iVar4 = pPars->TimeLimit;
    if ((long)iVar4 != 0) {
      aVar6 = Abc_Clock();
      if ((long)iVar4 <= (aVar6 - aVar5) / 1000000) {
        printf("Reached timeout after constructing global BDDs (%d seconds).\n",
               (ulong)(uint)pPars->TimeLimit,(aVar6 - aVar5) % 1000000);
        Cudd_Quit(dd);
        return -1;
      }
    }
    vOnionRings = Vec_PtrAlloc((int)dd_00);
    pbOutputs = Aig_ManCreateOutputs((DdManager *)dd_00,p);
    pbParts = Aig_ManCreatePartitions(dd,p,pPars->fReorder,pPars->fVerbose);
    n = Aig_ManInitStateVarMap(dd,p,fVerbose);
    Cudd_Ref(n);
    if (pPars->fReorderImage != 0) {
      Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
    }
    for (uVar9 = 0; iVar1 = p->nTruePos, (long)uVar9 < (long)iVar1; uVar9 = uVar9 + 1) {
      if (iVar11 == 0) {
        pDVar7 = pbOutputs[uVar9];
        iVar4 = Cudd_bddLeq(dd,n,(DdNode *)((ulong)pDVar7 ^ 1));
        if (iVar4 == 0) {
          pDVar7 = Cudd_bddIntersect(dd,n,pDVar7);
          Cudd_Ref(pDVar7);
          if (p->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("p->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                          ,0x1ed,"int Aig_ManVerifyUsingBdds_int(Aig_Man_t *, Saig_ParBbr_t *)");
          }
          pAVar8 = Aig_ManVerifyUsingBddsCountExample
                             (p,dd,pbParts,vOnionRings,pDVar7,(int)uVar9,pPars->fVerbose,
                              pPars->fSilent);
          p->pSeqModel = pAVar8;
          pDVar12 = dd;
          Cudd_RecursiveDeref(dd,pDVar7);
          if (pPars->fSilent == 0) {
            Abc_Print((int)pDVar12,"Output %d of miter \"%s\" was asserted in frame %d. ",
                      uVar9 & 0xffffffff,p->pName,0xffffffffffffffff);
          }
          break;
        }
      }
    }
    for (iVar4 = 0; iVar4 < vOnionRings->nSize; iVar4 = iVar4 + 1) {
      pDVar7 = (DdNode *)Vec_PtrEntry(vOnionRings,iVar4);
      Cudd_RecursiveDeref(dd,pDVar7);
    }
    Vec_PtrFree(vOnionRings);
    iVar4 = 0;
    if ((long)iVar1 <= (long)uVar9) {
      iVar4 = Aig_ManComputeReachable(dd,p,pbParts,n,pbOutputs,pPars,(uint)(iVar11 == 0));
    }
    Cudd_RecursiveDeref(dd,n);
    for (lVar10 = 0; lVar10 < p->nRegs; lVar10 = lVar10 + 1) {
      Cudd_RecursiveDeref(dd,pbParts[lVar10]);
    }
    free(pbParts);
    for (lVar10 = 0; lVar10 < p->nTruePos; lVar10 = lVar10 + 1) {
      Cudd_RecursiveDeref(dd,pbOutputs[lVar10]);
    }
    free(pbOutputs);
    Cudd_Quit(dd);
    iVar11 = (int)dd;
    if (pPars->fSilent == 0) {
      Abc_Print(iVar11,"%s =","Time");
      aVar6 = Abc_Clock();
      Abc_Print(iVar11,"%9.2f sec\n",(double)(aVar6 - aVar5) / 1000000.0);
      fflush(_stdout);
    }
  }
  return iVar4;
}

Assistant:

int Aig_ManVerifyUsingBdds_int( Aig_Man_t * p, Saig_ParBbr_t * pPars )
{
    int fCheckOutputs = !pPars->fSkipOutCheck;
    DdManager * dd;
    DdNode ** pbParts, ** pbOutputs;
    DdNode * bInitial, * bTemp;
    int RetValue, i;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vOnionRings;

    assert( Saig_ManRegNum(p) > 0 );

    // compute the global BDDs of the latches
    dd = Aig_ManComputeGlobalBdds( p, pPars->nBddMax, 1, pPars->fReorder, pPars->fVerbose );    
    if ( dd == NULL )
    {
        if ( !pPars->fSilent )
            printf( "The number of intermediate BDD nodes exceeded the limit (%d).\n", pPars->nBddMax );
        return -1;
    }
    if ( pPars->fVerbose )
        printf( "Shared BDD size is %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // check the runtime limit
    if ( pPars->TimeLimit && pPars->TimeLimit <= (Abc_Clock()-clk)/CLOCKS_PER_SEC )
    {
        printf( "Reached timeout after constructing global BDDs (%d seconds).\n",  pPars->TimeLimit );
        Cudd_Quit( dd );
        return -1;
    }

    // start the onion rings
    vOnionRings = Vec_PtrAlloc( 1000 );

    // save outputs
    pbOutputs = Aig_ManCreateOutputs( dd, p );

    // create partitions
    pbParts = Aig_ManCreatePartitions( dd, p, pPars->fReorder, pPars->fVerbose );

    // create the initial state and the variable map
    bInitial  = Aig_ManInitStateVarMap( dd, p, pPars->fVerbose );  Cudd_Ref( bInitial );

    // set reordering
    if ( pPars->fReorderImage )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

    // check the result
    RetValue = -1;
    for ( i = 0; i < Saig_ManPoNum(p); i++ )
    {
        if ( fCheckOutputs && !Cudd_bddLeq( dd, bInitial, Cudd_Not(pbOutputs[i]) ) )
        {
            DdNode * bIntersect;
            bIntersect = Cudd_bddIntersect( dd, bInitial, pbOutputs[i] );  Cudd_Ref( bIntersect );
            assert( p->pSeqModel == NULL );
            p->pSeqModel = Aig_ManVerifyUsingBddsCountExample( p, dd, pbParts, 
                vOnionRings, bIntersect, i, pPars->fVerbose, pPars->fSilent ); 
            Cudd_RecursiveDeref( dd, bIntersect );
            if ( !pPars->fSilent )
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", i, p->pName, -1 );
            RetValue = 0;
            break;
        }
    }
    // free the onion rings
    Vec_PtrForEachEntry( DdNode *, vOnionRings, bTemp, i )
        Cudd_RecursiveDeref( dd, bTemp );
    Vec_PtrFree( vOnionRings );
    // explore reachable states
    if ( RetValue == -1 )
        RetValue = Aig_ManComputeReachable( dd, p, pbParts, bInitial, pbOutputs, pPars, fCheckOutputs ); 

    // cleanup
    Cudd_RecursiveDeref( dd, bInitial );
    for ( i = 0; i < Saig_ManRegNum(p); i++ )
        Cudd_RecursiveDeref( dd, pbParts[i] );
    ABC_FREE( pbParts );
    for ( i = 0; i < Saig_ManPoNum(p); i++ )
        Cudd_RecursiveDeref( dd, pbOutputs[i] );
    ABC_FREE( pbOutputs );
//    if ( RetValue == -1 )
        Cudd_Quit( dd );
//    else
//        Bbr_StopManager( dd );

    // report the runtime
    if ( !pPars->fSilent )
    {
    ABC_PRT( "Time", Abc_Clock() - clk );
    fflush( stdout );
    }
    return RetValue;
}